

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O2

void __thiscall r_exec::CSTController::check_last_match_time(CSTController *this,bool match)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  undefined3 in_register_00000031;
  
  uVar2 = (*Now)();
  if (CONCAT31(in_register_00000031,match) == 0) {
    uVar1 = (this->super_HLPController).last_match_time;
    lVar3 = r_code::Mem::Get();
    if (*(ulong *)(lVar3 + 0x70) < uVar2 - uVar1) {
      (*(this->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object
        [7])(this);
      return;
    }
  }
  else {
    (this->super_HLPController).last_match_time = uVar2;
  }
  return;
}

Assistant:

void CSTController::check_last_match_time(bool match)
{
    uint64_t now = Now();

    if (match) {
        last_match_time = now;
    } else if (now - last_match_time > _Mem::Get()->get_primary_thz()) {
        kill_views();
    }
}